

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

void __thiscall nnad::Matrix<double>::operator=(Matrix<double> *this,Matrix<double> *term)

{
  int iVar1;
  _Vector_base<double,_std::allocator<double>_> _Stack_28;
  
  iVar1 = term->_Columns;
  this->_Lines = term->_Lines;
  this->_Columns = iVar1;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&_Stack_28,&term->_Matrix);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->_Matrix,&_Stack_28);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_28);
  return;
}

Assistant:

void operator = (Matrix<T> const& term)
    {
      _Lines   = term.GetLines();
      _Columns = term.GetColumns();
      _Matrix  = term.GetVector();
    }